

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deInt64 deFile_getSize(deFile *file)

{
  __off_t __offset;
  __off_t _Var1;
  __off_t _Var2;
  
  __offset = lseek(file->fd,0,1);
  _Var2 = -1;
  if (-1 < __offset) {
    _Var1 = lseek(file->fd,0,2);
    if (-1 < _Var1) {
      lseek(file->fd,__offset,0);
      _Var2 = _Var1;
    }
  }
  return _Var2;
}

Assistant:

deInt64 deFile_getSize (const deFile* file)
{
	deInt64 size	= 0;
	deInt64 curPos	= lseek(file->fd, 0, SEEK_CUR);

	if (curPos < 0)
		return -1;

	size = lseek(file->fd, 0, SEEK_END);

	if (size < 0)
		return -1;

	lseek(file->fd, (off_t)curPos, SEEK_SET);

	return size;
}